

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::doRemoveRow(SPxSolverBase<double> *this,int i)

{
  SPxStatus SVar1;
  long *in_RDI;
  int in_stack_0000002c;
  SPxLPBase<double> *in_stack_00000030;
  int in_stack_0000003c;
  SPxBasisBase<double> *in_stack_00000040;
  SPxBasisBase<double> *this_00;
  SPxStatus stat;
  undefined4 in_stack_ffffffffffffffe0;
  
  SPxLPBase<double>::doRemoveRow(in_stack_00000030,in_stack_0000002c);
  (**(code **)(*in_RDI + 0x3b8))();
  SVar1 = SPxBasisBase<double>::status((SPxBasisBase<double> *)(in_RDI + 0x39));
  if (SVar1 < SINGULAR) {
    return;
  }
  this_00 = (SPxBasisBase<double> *)(in_RDI + 0x39);
  SPxBasisBase<double>::removedRow(in_stack_00000040,in_stack_0000003c);
  SVar1 = SPxBasisBase<double>::status(this_00);
  stat = (SPxStatus)((ulong)this_00 >> 0x20);
  if (SVar1 != DUAL) {
    if (SVar1 == OPTIMAL) {
      setBasisStatus((SPxSolverBase<double> *)CONCAT44(3,in_stack_ffffffffffffffe0),stat);
      return;
    }
    if (SVar1 != INFEASIBLE) {
      return;
    }
  }
  setBasisStatus((SPxSolverBase<double> *)CONCAT44(SVar1,in_stack_ffffffffffffffe0),stat);
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveRow(int i)
{

   SPxLPBase<R>::doRemoveRow(i);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedRow(i);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::DUAL:
      case SPxBasisBase<R>::INFEASIBLE:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::PRIMAL);
         break;

      default:
         break;
      }
   }
}